

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

void __thiscall Json::StyledWriter::indent(StyledWriter *this)

{
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct((ulong)local_38,(char)this->indentSize_);
  std::__cxx11::string::_M_append((char *)&this->indentString_,(ulong)local_38[0]);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0]);
  }
  return;
}

Assistant:

void StyledWriter::indent() { indentString_ += std::string(indentSize_, ' '); }